

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,uint qdirFilters,
          uint qdirIteratorFlags)

{
  void *pvVar1;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  Int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QFileSystemEntry *this_00;
  undefined8 uVar2;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate((QDirListingPrivate *)CONCAT44(in_ECX,in_R8D));
  *in_RDI = pvVar1;
  this_00 = &local_40;
  QFileSystemEntry::QFileSystemEntry
            (this_00,(QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QFileSystemEntry::operator=
            (this_00,(QFileSystemEntry *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QFileSystemEntry::~QFileSystemEntry(this_00);
  QList<QString>::operator=
            ((QList<QString> *)this_00,
             (QList<QString> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = *in_RDI;
  QFlags<QDir::Filter>::fromInt(in_stack_ffffffffffffff58);
  QFlags<QDirIterator::IteratorFlag>::fromInt(in_stack_ffffffffffffff58);
  QDirListingPrivate::setLegacyFilters
            ((QDirListingPrivate *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (QFlagsStorageHelper<QDir::Filter,_4>)SUB84((ulong)uVar2 >> 0x20,0),
             (QFlagsStorageHelper<QDirIterator::IteratorFlag,_4>)SUB84(uVar2,0));
  QDirListingPrivate::init((QDirListingPrivate *)*in_RDI,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, uint qdirFilters,
                         uint qdirIteratorFlags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->setLegacyFilters(QDir::Filters::fromInt(qdirFilters),
                        QDirIterator::IteratorFlags::fromInt(qdirIteratorFlags));
    d->init();
}